

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O1

void __thiscall
QueryTests_DropDatabase_canDetermineSpecificationForDropDatabase_Test::TestBody
          (QueryTests_DropDatabase_canDetermineSpecificationForDropDatabase_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  char *in_R9;
  AssertionResult gtest_ar_;
  Query query_drop_database;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  AssertHelper local_158;
  internal local_150 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  string local_140;
  Query local_120;
  
  database::Query::Query(&local_120,"drop database company");
  local_150[0] = (internal)(local_120.m_transaction_metatype == ddl);
  local_148.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((bool)local_150[0]) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_148,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    paVar1 = &local_140.field_2;
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_120.m_database_name._M_dataplus._M_p,
               local_120.m_database_name._M_dataplus._M_p +
               local_120.m_database_name._M_string_length);
    iVar3 = std::__cxx11::string::compare((char *)&local_140);
    local_150[0] = (internal)(iVar3 == 0);
    local_148.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_150[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_160);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_140,local_150,
                 (AssertionResult *)"query_drop_database.databaseName() == \"company\"","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_158,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
                 ,0xf8,local_140._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_158);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar1) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      if (local_160.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_160.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_160.ptr_ + 8))();
        }
        local_160.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_148,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_140,local_150,
               (AssertionResult *)"query_drop_database.transactionMetaType() == database::ddl",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/sarkarchandan[P]Edgar/tests/database_query_tests.cpp"
               ,0xf7,local_140._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_158,(Message *)&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
    if (local_160.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_160.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_160.ptr_ + 8))();
      }
      local_160.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_148,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  database::Query::~Query(&local_120);
  return;
}

Assistant:

TEST(QueryTests_DropDatabase,canDetermineSpecificationForDropDatabase)
{
  database::Query query_drop_database = "drop database company";
  ASSERT_TRUE(query_drop_database.transactionMetaType() == database::ddl);
  ASSERT_TRUE(query_drop_database.databaseName() == "company");
}